

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  byte c_00;
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  size_t sVar4;
  char *pcVar5;
  ulong local_50;
  size_t n_1;
  ulong uStack_40;
  uchar nc;
  size_t n;
  uint32_t value;
  bool valid;
  size_t encBytes;
  ulong uStack_20;
  uchar c;
  size_t idx;
  ostream *os_local;
  XmlEncode *this_local;
  
  for (uStack_20 = 0; uVar2 = std::__cxx11::string::size(), uStack_20 < uVar2;
      uStack_20 = uStack_20 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)this);
    c_00 = *pbVar3;
    switch(c_00) {
    case 0x22:
      if (this->m_forWhat == ForAttributes) {
        std::operator<<(os,"&quot;");
      }
      else {
        std::operator<<(os,c_00);
      }
      break;
    default:
      if (((c_00 < 9) || ((0xd < c_00 && (c_00 < 0x20)))) || (c_00 == 0x7f)) {
        anon_unknown_1::hexEscapeChar(os,c_00);
      }
      else if (c_00 < 0x7f) {
        std::operator<<(os,c_00);
      }
      else if ((c_00 < 0xc0) || (0xf7 < c_00)) {
        anon_unknown_1::hexEscapeChar(os,c_00);
      }
      else {
        sVar4 = anon_unknown_1::trailingBytes(c_00);
        uVar2 = std::__cxx11::string::size();
        if ((uStack_20 + sVar4) - 1 < uVar2) {
          bVar1 = true;
          n._0_4_ = anon_unknown_1::headerValue(c_00);
          for (uStack_40 = 1; uStack_40 < sVar4; uStack_40 = uStack_40 + 1) {
            pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)this);
            bVar1 = (bool)(bVar1 & (*pbVar3 & 0xc0) == 0x80);
            n._0_4_ = (uint32_t)n << 6 | *pbVar3 & 0x3f;
          }
          if (((((bVar1) && (0x7f < (uint32_t)n)) &&
               (((uint32_t)n < 0x80 || ((0x7ff < (uint32_t)n || (sVar4 < 3)))))) &&
              (((uint32_t)n < 0x801 || ((0xffff < (uint32_t)n || (sVar4 < 4)))))) &&
             ((uint32_t)n < 0x110000)) {
            for (local_50 = 0; local_50 < sVar4; local_50 = local_50 + 1) {
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this);
              std::operator<<(os,*pcVar5);
            }
            uStack_20 = (sVar4 - 1) + uStack_20;
          }
          else {
            anon_unknown_1::hexEscapeChar(os,c_00);
          }
        }
        else {
          anon_unknown_1::hexEscapeChar(os,c_00);
        }
      }
      break;
    case 0x26:
      std::operator<<(os,"&amp;");
      break;
    case 0x3c:
      std::operator<<(os,"&lt;");
      break;
    case 0x3e:
      if (((uStack_20 < 3) ||
          (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar5 != ']')) ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar5 != ']')) {
        std::operator<<(os,c_00);
      }
      else {
        std::operator<<(os,"&gt;");
      }
    }
  }
  return;
}

Assistant:

void XmlEncode::encodeTo( std::ostream& os ) const {
        // Apostrophe escaping not necessary if we always use " to write attributes
        // (see: http://www.w3.org/TR/xml/#syntax)

        for( std::size_t idx = 0; idx < m_str.size(); ++ idx ) {
            unsigned char c = m_str[idx];
            switch (c) {
            case '<':   os << "&lt;"; break;
            case '&':   os << "&amp;"; break;

            case '>':
                // See: http://www.w3.org/TR/xml/#syntax
                if (idx > 2 && m_str[idx - 1] == ']' && m_str[idx - 2] == ']')
                    os << "&gt;";
                else
                    os << c;
                break;

            case '\"':
                if (m_forWhat == ForAttributes)
                    os << "&quot;";
                else
                    os << c;
                break;

            default:
                // Check for control characters and invalid utf-8

                // Escape control characters in standard ascii
                // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                if (c < 0x09 || (c > 0x0D && c < 0x20) || c == 0x7F) {
                    hexEscapeChar(os, c);
                    break;
                }

                // Plain ASCII: Write it to stream
                if (c < 0x7F) {
                    os << c;
                    break;
                }

                // UTF-8 territory
                // Check if the encoding is valid and if it is not, hex escape bytes.
                // Important: We do not check the exact decoded values for validity, only the encoding format
                // First check that this bytes is a valid lead byte:
                // This means that it is not encoded as 1111 1XXX
                // Or as 10XX XXXX
                if (c <  0xC0 ||
                    c >= 0xF8) {
                    hexEscapeChar(os, c);
                    break;
                }

                auto encBytes = trailingBytes(c);
                // Are there enough bytes left to avoid accessing out-of-bounds memory?
                if (idx + encBytes - 1 >= m_str.size()) {
                    hexEscapeChar(os, c);
                    break;
                }
                // The header is valid, check data
                // The next encBytes bytes must together be a valid utf-8
                // This means: bitpattern 10XX XXXX and the extracted value is sane (ish)
                bool valid = true;
                uint32_t value = headerValue(c);
                for (std::size_t n = 1; n < encBytes; ++n) {
                    unsigned char nc = m_str[idx + n];
                    valid &= ((nc & 0xC0) == 0x80);
                    value = (value << 6) | (nc & 0x3F);
                }

                if (
                    // Wrong bit pattern of following bytes
                    (!valid) ||
                    // Overlong encodings
                    (value < 0x80) ||
                    (0x80 <= value && value < 0x800   && encBytes > 2) ||
                    (0x800 < value && value < 0x10000 && encBytes > 3) ||
                    // Encoded value out of range
                    (value >= 0x110000)
                    ) {
                    hexEscapeChar(os, c);
                    break;
                }

                // If we got here, this is in fact a valid(ish) utf-8 sequence
                for (std::size_t n = 0; n < encBytes; ++n) {
                    os << m_str[idx + n];
                }
                idx += encBytes - 1;
                break;
            }
        }
    }